

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rMayHaveNull,int isRowid)

{
  u8 uVar1;
  ExprList *pEVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int p1;
  Vdbe *p;
  Vdbe *p_00;
  Expr *pEVar8;
  long lVar9;
  int p1_00;
  char *pcVar10;
  Select *pSVar11;
  ExprList_item *pEVar12;
  char affinity;
  int iValToIns;
  KeyInfo keyInfo;
  char local_a5;
  int local_a4;
  int local_a0;
  uint local_9c;
  int local_98;
  int local_94;
  Parse *local_90;
  Walker local_88;
  char local_58 [16];
  u8 *local_48;
  CollSeq *pCStack_40;
  
  local_98 = isRowid;
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    return 0;
  }
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  local_9c = 0xffffffff;
  if ((pExpr->flags & 0x20) == 0) {
    p_00 = sqlite3GetVdbe(pParse);
    iVar5 = pParse->nOnce;
    pParse->nOnce = iVar5 + 1;
    local_9c = sqlite3VdbeAddOp3(p_00,0x1a,iVar5,0,0);
  }
  if (pParse->explain == '\x02') {
    pcVar10 = "CORRELATED ";
    if (-1 < (int)local_9c) {
      pcVar10 = "";
    }
    pcVar10 = sqlite3MPrintf(pParse->db,"EXECUTE %s%s SUBQUERY %d",pcVar10);
    iVar5 = sqlite3VdbeAddOp3(p,0x96,pParse->iSelectId,0,0);
    sqlite3VdbeChangeP4(p,iVar5,pcVar10,-1);
  }
  uVar1 = pExpr->op;
  if (uVar1 != 'H') {
    pSVar11 = (pExpr->x).pSelect;
    iVar5 = pParse->nMem + 1;
    pParse->nMem = iVar5;
    local_88.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_88.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)
         (CONCAT71((int7)(CONCAT44(iVar5,(int)local_88.xExprCallback) >> 8),
                   (uVar1 == 't') * '\x03' + '\x03') & 0xffffffffffff00ff);
    sqlite3VdbeAddOp3(p,(uint)(uVar1 == 't') * 3 + 7,0,iVar5,0);
    sqlite3ExprDelete(pParse->db,pSVar11->pLimit);
    pEVar8 = sqlite3PExpr(pParse,0x81,(Expr *)0x0,(Expr *)0x0,sqlite3IntTokens + 1);
    pSVar11->pLimit = pEVar8;
    pSVar11->iLimit = 0;
    iVar6 = sqlite3Select(pParse,pSVar11,(SelectDest *)&local_88);
    iVar5 = (int)pSVar11;
    if (iVar6 != 0) {
      return 0;
    }
    iVar6 = local_88.xExprCallback._4_4_;
    goto LAB_0016995c;
  }
  pEVar8 = pExpr->pLeft;
  if (rMayHaveNull != 0) {
    sqlite3VdbeAddOp3(p,10,0,rMayHaveNull,0);
  }
  local_a5 = sqlite3ExprAffinity(pEVar8);
  iVar6 = pParse->nTab;
  pParse->nTab = iVar6 + 1;
  pExpr->iTable = iVar6;
  iVar5 = 0x2a;
  iVar6 = sqlite3VdbeAddOp3(p,0x2a,iVar6,(uint)(local_98 == 0),0);
  if ((rMayHaveNull == 0) && (p->aOp != (Op *)0x0)) {
    p->aOp[(long)p->nOp + -1].p5 = '\b';
  }
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  pCStack_40 = (CollSeq *)0x0;
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\x01';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_48 = &sqlite3CodeSubselect::sortOrder;
  if ((pExpr->flags & 0x800) == 0) {
    pEVar2 = (pExpr->x).pList;
    local_94 = iVar6;
    if (pEVar2 != (ExprList *)0x0) {
      if (local_a5 == '\0') {
        local_a5 = 'b';
      }
      pCStack_40 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
      local_48 = &sqlite3CodeSubselect::sortOrder;
      if (pParse->nTempReg == '\0') {
        local_a4 = pParse->nMem + 1;
        pParse->nMem = local_a4;
      }
      else {
        bVar4 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar4;
        local_a4 = pParse->aTempReg[bVar4];
      }
      if (pParse->nTempReg == '\0') {
        local_a0 = pParse->nMem + 1;
        pParse->nMem = local_a0;
      }
      else {
        bVar4 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar4;
        local_a0 = pParse->aTempReg[bVar4];
      }
      iVar5 = 10;
      sqlite3VdbeAddOp3(p,10,0,local_a0,0);
      if (0 < pEVar2->nExpr) {
        pEVar12 = pEVar2->a;
        iVar6 = pEVar2->nExpr + 1;
        local_90 = pParse;
        do {
          pEVar8 = pEVar12->pExpr;
          if (-1 < (int)local_9c) {
            local_88.pParse = (Parse *)0x0;
            local_88.walkerDepth = 0;
            local_88.bSelectDepthFirst = '\0';
            local_88._29_3_ = 0;
            local_88.u = (anon_union_8_4_3af73d92_for_u)0x1;
            local_88.xExprCallback = exprNodeIsConstant;
            local_88.xSelectCallback = selectNodeIsConstant;
            sqlite3WalkExpr(&local_88,pEVar8);
            if (local_88.u.i == 0) {
              sqlite3VdbeChangeToNoop(p,local_9c);
              local_9c = 0xffffffff;
            }
          }
          if ((local_98 == 0) || (iVar5 = sqlite3ExprIsInteger(pEVar8,(int *)&local_88), iVar5 == 0)
             ) {
            p1 = sqlite3ExprCodeTarget(pParse,pEVar8,local_a4);
            iVar7 = local_a0;
            if (local_98 == 0) {
              iVar5 = sqlite3VdbeAddOp3(p,0x1f,p1,1,local_a0);
              sqlite3VdbeChangeP4(p,iVar5,&local_a5,1);
              sqlite3ExprCacheRemove(local_90,p1,1);
              p1_00 = pExpr->iTable;
              iVar5 = 0x61;
              p1 = 0;
              pParse = local_90;
            }
            else {
              sqlite3VdbeAddOp3(p,0x15,p1,p->nOp + 2,0);
              p1_00 = pExpr->iTable;
              iVar5 = 0x39;
              iVar7 = local_a0;
            }
          }
          else {
            p1_00 = pExpr->iTable;
            iVar5 = 0x3a;
            iVar7 = local_a0;
            p1 = (int)local_88.xExprCallback;
          }
          sqlite3VdbeAddOp3(p,iVar5,p1_00,iVar7,p1);
          pEVar12 = pEVar12 + 1;
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
      }
      if (local_a4 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          lVar9 = 0;
          do {
            iVar5 = local_a4;
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar9) == local_a4) {
              (&pParse->aColCache[0].tempReg)[lVar9] = '\x01';
              goto LAB_001698fa;
            }
            lVar9 = lVar9 + 0x18;
          } while ((int)lVar9 != 0xf0);
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = local_a4;
        }
      }
LAB_001698fa:
      iVar6 = local_94;
      if (local_a0 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          lVar9 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar9) == local_a0) {
              (&pParse->aColCache[0].tempReg)[lVar9] = '\x01';
              goto LAB_00169930;
            }
            lVar9 = lVar9 + 0x18;
          } while ((int)lVar9 != 0xf0);
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = local_a0;
        }
      }
    }
LAB_00169930:
    bVar3 = true;
    if (local_98 == 0) {
      iVar5 = iVar6;
      sqlite3VdbeChangeP4(p,iVar6,local_58,-6);
    }
  }
  else {
    local_88.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)CONCAT71(local_88.xExprCallback._1_7_,7);
    local_88.xExprCallback =
         (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(pExpr->iTable,(int)local_88.xExprCallback);
    local_88.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_88.xExprCallback._0_2_ = CONCAT11(local_a5,7);
    ((pExpr->x).pSelect)->iLimit = 0;
    pSVar11 = (pExpr->x).pSelect;
    iVar7 = sqlite3Select(pParse,pSVar11,(SelectDest *)&local_88);
    iVar5 = (int)pSVar11;
    if (iVar7 == 0) {
      pEVar2 = ((pExpr->x).pSelect)->pEList;
      if ((pEVar2 != (ExprList *)0x0) && (0 < pEVar2->nExpr)) {
        pEVar8 = pExpr->pLeft;
        pCStack_40 = sqlite3BinaryCompareCollSeq(pParse,pEVar8,pEVar2->a->pExpr);
        iVar5 = (int)pEVar8;
      }
      goto LAB_00169930;
    }
    bVar3 = false;
  }
  iVar6 = 0;
  if (!bVar3) {
    return 0;
  }
LAB_0016995c:
  if ((-1 < (int)local_9c) && (local_9c < (uint)p->nOp)) {
    p->aOp[local_9c].p2 = p->nOp;
  }
  sqlite3ExprCachePop(pParse,iVar5);
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rMayHaveNull,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int testAddr = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;
  sqlite3ExprCachePush(pParse);

  /* This code must be run in its entirety every time it is encountered
  ** if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasAnyProperty(pExpr, EP_VarSelect) ){
    testAddr = sqlite3CodeOnce(pParse);
  }

#ifndef SQLITE_OMIT_EXPLAIN
  if( pParse->explain==2 ){
    char *zMsg = sqlite3MPrintf(
        pParse->db, "EXECUTE %s%s SUBQUERY %d", testAddr>=0?"":"CORRELATED ",
        pExpr->op==TK_IN?"LIST":"SCALAR", pParse->iNextSelectId
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
#endif

  switch( pExpr->op ){
    case TK_IN: {
      char affinity;              /* Affinity of the LHS of the IN */
      KeyInfo keyInfo;            /* Keyinfo for the generated table */
      static u8 sortOrder = 0;    /* Fake aSortOrder for keyInfo */
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */

      if( rMayHaveNull ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, rMayHaveNull);
      }

      affinity = sqlite3ExprAffinity(pLeft);

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with single-field index keys representing the results
      ** from the SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, !isRowid);
      if( rMayHaveNull==0 ) sqlite3VdbeChangeP5(v, BTREE_UNORDERED);
      memset(&keyInfo, 0, sizeof(keyInfo));
      keyInfo.nField = 1;
      keyInfo.aSortOrder = &sortOrder;

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        SelectDest dest;
        ExprList *pEList;

        assert( !isRowid );
        sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
        dest.affSdst = (u8)affinity;
        assert( (pExpr->iTable&0x0000FFFF)==pExpr->iTable );
        pExpr->x.pSelect->iLimit = 0;
        if( sqlite3Select(pParse, pExpr->x.pSelect, &dest) ){
          return 0;
        }
        pEList = pExpr->x.pSelect->pEList;
        if( ALWAYS(pEList!=0 && pEList->nExpr>0) ){ 
          keyInfo.aColl[0] = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft,
              pEList->a[0].pExpr);
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;

        if( !affinity ){
          affinity = SQLITE_AFF_NONE;
        }
        keyInfo.aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        keyInfo.aSortOrder = &sortOrder;

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, r2);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( testAddr>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, testAddr);
            testAddr = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3ExprCacheAffinityChange(pParse, r3, 1);
              sqlite3VdbeAddOp2(v, OP_IdxInsert, pExpr->iTable, r2);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( !isRowid ){
        sqlite3VdbeChangeP4(v, addr, (void *)&keyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* If this has to be a scalar SELECT.  Generate code to put the
      ** value of this select in a memory cell and record the number
      ** of the memory cell in iColumn.  If this is an EXISTS, write
      ** an integer 0 (not exists) or 1 (exists) into a memory cell
      ** and record that memory cell in iColumn.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECt result */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );

      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      pSel = pExpr->x.pSelect;
      sqlite3SelectDestInit(&dest, 0, ++pParse->nMem);
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        sqlite3VdbeAddOp2(v, OP_Null, 0, dest.iSDParm);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      sqlite3ExprDelete(pParse->db, pSel->pLimit);
      pSel->pLimit = sqlite3PExpr(pParse, TK_INTEGER, 0, 0,
                                  &sqlite3IntTokens[1]);
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetIrreducible(pExpr);
      break;
    }
  }

  if( testAddr>=0 ){
    sqlite3VdbeJumpHere(v, testAddr);
  }
  sqlite3ExprCachePop(pParse, 1);

  return rReg;
}